

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall tcu::transpose<float,2,2>(tcu *this,Matrix<float,_2,_2> *mat)

{
  int row;
  long lVar1;
  int col;
  long lVar2;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar3;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar4;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar3.m_data = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      VVar3.m_data[1] = 0.0;
      VVar3.m_data[0] = *(float *)((long)mat + lVar2 * 2 * 4);
      *(float *)(this + lVar2 * 4) = *(float *)((long)mat + lVar2 * 2 * 4);
    }
    this = this + 8;
    mat = (Matrix<float,_2,_2> *)((long)mat + 4);
  }
  MVar4.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar4.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar4.m_data.m_data[0].m_data[0] = VVar3.m_data[0];
  MVar4.m_data.m_data[0].m_data[1] = VVar3.m_data[1];
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}